

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

void fill_suite::back_inserter_fill_n_full(void)

{
  initializer_list<int> __l;
  iterator first_begin;
  iterator first_end;
  allocator_type local_a1;
  vector<int,_std::allocator<int>_> expect;
  size_type local_78 [2];
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  span.member.cap = 4;
  span.member.size = 0;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.next = 4;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x37);
  std::
  __fill_n_a1<std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>,unsigned_long,int>
            (&span,8,(int *)&expect);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)span.member.size;
  local_78[0] = span.member.cap;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_long>
            ("span.size()","span.capacity()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x113,"void fill_suite::back_inserter_fill_n_full()",&expect,local_78);
  local_78[0] = 0x3700000037;
  local_78[1] = 0x3700000037;
  __l._M_len = 4;
  __l._M_array = (iterator)local_78;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_a1);
  first_begin = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  first_end = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x117,"void fill_suite::back_inserter_fill_n_full()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void back_inserter_fill_n_full()
{
    int array[4] = {};
    circular_view<int> span(array);
    std::fill_n(std::back_inserter(span), 2 * span.capacity(), 55);
    BOOST_TEST_EQ(span.size(), span.capacity());
    {
        std::vector<int> expect = { 55, 55, 55, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}